

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

decoder_tables * __thiscall
crnd::prefix_coding::decoder_tables::operator=(decoder_tables *this,decoder_tables *other)

{
  uint *__dest;
  unsigned_short *__dest_00;
  
  if (this != other) {
    clear(this);
    memcpy(this,other,0xc0);
    if (other->m_lookup != (uint32 *)0x0) {
      __dest = crnd_new_array<unsigned_int>(this->m_cur_lookup_size);
      this->m_lookup = __dest;
      if (__dest != (uint *)0x0) {
        memcpy(__dest,other->m_lookup,(ulong)this->m_cur_lookup_size << 2);
      }
    }
    if (other->m_sorted_symbol_order != (uint16 *)0x0) {
      __dest_00 = crnd_new_array<unsigned_short>(this->m_cur_sorted_symbol_order_size);
      this->m_sorted_symbol_order = __dest_00;
      if (__dest_00 != (unsigned_short *)0x0) {
        memcpy(__dest_00,other->m_sorted_symbol_order,
               (ulong)this->m_cur_sorted_symbol_order_size * 2);
      }
    }
  }
  return this;
}

Assistant:

decoder_tables& operator=(const decoder_tables& other)
            {
                if (this == &other)
                    return *this;

                clear();

                memcpy(this, &other, sizeof(*this));

                if (other.m_lookup)
                {
                    m_lookup = crnd_new_array<uint32>(m_cur_lookup_size);
                    if (m_lookup)
                        memcpy(m_lookup, other.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
                }

                if (other.m_sorted_symbol_order)
                {
                    m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
                    if (m_sorted_symbol_order)
                        memcpy(m_sorted_symbol_order, other.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
                }

                return *this;
            }